

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddReord.c
# Opt level: O2

Move * cuddZddSiftingUp(DdManager *table,int x,int x_low,int initial_size)

{
  int iVar1;
  DdNode *pDVar2;
  DdNode *pDVar3;
  
  pDVar3 = (DdNode *)0x0;
  while( true ) {
    if (x <= x_low) {
      return (Move *)pDVar3;
    }
    iVar1 = cuddZddSwapInPlace(table,x - 1U,x);
    if ((iVar1 == 0) || (pDVar2 = cuddDynamicAllocNode(table), pDVar2 == (DdNode *)0x0)) break;
    pDVar2->index = x - 1U;
    pDVar2->ref = x;
    *(int *)((long)&pDVar2->next + 4) = iVar1;
    (pDVar2->type).kids.T = pDVar3;
    if ((double)initial_size * table->maxGrowth < (double)iVar1) {
      return (Move *)pDVar2;
    }
    if (iVar1 < initial_size) {
      initial_size = iVar1;
    }
    x = x - 1;
    pDVar3 = pDVar2;
  }
  while (pDVar3 != (DdNode *)0x0) {
    pDVar2 = (pDVar3->type).kids.T;
    pDVar3->ref = 0;
    pDVar3->next = table->nextFree;
    table->nextFree = pDVar3;
    pDVar3 = pDVar2;
  }
  return (Move *)0x0;
}

Assistant:

static Move *
cuddZddSiftingUp(
  DdManager * table,
  int  x,
  int  x_low,
  int  initial_size)
{
    Move        *moves;
    Move        *move;
    int         y;
    int         size;
    int         limit_size = initial_size;

    moves = NULL;
    y = cuddZddNextLow(table, x);
    while (y >= x_low) {
        size = cuddZddSwapInPlace(table, y, x);
        if (size == 0)
            goto cuddZddSiftingUpOutOfMem;
        move = (Move *)cuddDynamicAllocNode(table);
        if (move == NULL)
            goto cuddZddSiftingUpOutOfMem;
        move->x = y;
        move->y = x;
        move->size = size;
        move->next = moves;
        moves = move;

        if ((double)size > (double)limit_size * table->maxGrowth)
            break;
        if (size < limit_size)
            limit_size = size;

        x = y;
        y = cuddZddNextLow(table, x);
    }
    return(moves);

cuddZddSiftingUpOutOfMem:
    while (moves != NULL) {
        move = moves->next;
        cuddDeallocMove(table, moves);
        moves = move;
    }
    return(NULL);

}